

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::Write
          (PixieProvider *this,ByteBuffer *buffer,OutputStream *out)

{
  size_t sVar1;
  uchar *puVar2;
  rep rVar3;
  
  sVar1 = tools::ByteBuffer::ReadableBytes(buffer);
  tools::Varint::WriteU32(out,(uint32_t)sVar1);
  puVar2 = tools::ByteBuffer::ToArray(buffer);
  (*out->_vptr_OutputStream[1])(out,puVar2,sVar1);
  operator_delete(puVar2,1);
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->last_write_time_).__d.__r = rVar3;
  return;
}

Assistant:

void PixieProvider::Write(ByteBuffer& buffer, OutputStream& out)
{
    size_t frame_length = buffer.ReadableBytes();
    Varint::WriteU32(out, static_cast<unsigned int>(frame_length));
    unsigned char* bytes_to_write = buffer.ToArray();
    out.WriteBytes(bytes_to_write, frame_length);
    delete(bytes_to_write);
    last_write_time_ = std::chrono::high_resolution_clock::now();
}